

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O3

void hd_vthrow(hd_context *ctx,int code,char *fmt,__va_list_tag *ap)

{
  hd_error_context *phVar1;
  
  phVar1 = ctx->error;
  phVar1->errcode = code;
  snprintf(phVar1->message,0x100,fmt);
  ctx->error->message[0xff] = '\0';
  if (code != 5) {
    hd_flush_warnings(ctx);
    fprintf(_stderr,"error: %s\n",ctx->error->message);
  }
  throw((hd_context *)ctx->error);
}

Assistant:

void hd_vthrow(hd_context *ctx, int code, const char *fmt, va_list ap)
{
	ctx->error->errcode = code;
	snprintf(ctx->error->message, sizeof ctx->error->message, fmt, ap);
	ctx->error->message[sizeof(ctx->error->message) - 1] = 0;

	if (code != HD_ERROR_ABORT)
	{
		hd_flush_warnings(ctx);
		fprintf(stderr, "error: %s\n", ctx->error->message);
#ifdef USE_OUTPUT_DEBUG_STRING
		OutputDebugStringA("error: ");
		OutputDebugStringA(ctx->error->message);
		OutputDebugStringA("\n");
#endif
	}

	throw(ctx);
}